

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-sharedata.c
# Opt level: O3

int convtable(lua_State *L)

{
  table *ptVar1;
  value vVar2;
  uint uVar3;
  int iVar4;
  context *ctx;
  size_t sVar5;
  uint8_t *puVar6;
  value *pvVar7;
  node *pnVar8;
  table *in_RCX;
  node *n_00;
  long lVar9;
  ulong uVar10;
  int *in_R9;
  uint uVar11;
  ulong uVar12;
  int key;
  int keytype;
  uint32_t keyhash;
  node n;
  uint local_5c;
  uint local_58;
  value local_54;
  undefined4 uStack_4c;
  uint8_t local_3b;
  table *local_38;
  
  ctx = (context *)lua_touserdata(L,2);
  ptVar1 = ctx->tbl;
  ptVar1->L = ctx->L;
  sVar5 = lua_rawlen(L,1);
  uVar11 = (uint)sVar5;
  if (uVar11 == 0) {
    uVar3 = countsize(L,0);
    if (uVar3 == 0) {
      return 0;
    }
  }
  else {
    puVar6 = (uint8_t *)malloc((long)(int)uVar11);
    ptVar1->arraytype = puVar6;
    if (puVar6 == (uint8_t *)0x0) goto LAB_001239b2;
    if (0 < (int)uVar11) {
      in_RCX = (table *)0x0;
      do {
        ptVar1->arraytype[(long)in_RCX] = '\0';
        in_RCX = (table *)((long)&in_RCX->sizearray + 1);
      } while ((table *)(ulong)(uVar11 & 0x7fffffff) != in_RCX);
    }
    pvVar7 = (value *)malloc((long)(sVar5 << 0x20) >> 0x1d);
    ptVar1->array = pvVar7;
    if (pvVar7 == (value *)0x0) goto LAB_001239b2;
    ptVar1->sizearray = uVar11;
    uVar3 = countsize(L,uVar11);
    if (uVar3 == 0) {
      if ((int)uVar11 < 1) {
        return 0;
      }
      uVar12 = 1;
      do {
        lua_rawgeti(L,1,uVar12);
        setvalue(ctx,L,(int)&local_54 + 4,(node *)in_RCX);
        ptVar1 = ctx->tbl;
        ptVar1->arraytype[uVar12 - 1] = local_3b;
        in_RCX = (table *)CONCAT44(uStack_4c,local_54.d._4_4_);
        ptVar1->array[uVar12 - 1].tbl = in_RCX;
        lua_settop(L,-2);
        uVar12 = uVar12 + 1;
      } while (uVar11 + 1 != uVar12);
      return 0;
    }
  }
  pnVar8 = (node *)malloc((long)(int)uVar3 * 0x18);
  ptVar1->hash = pnVar8;
  if (pnVar8 != (node *)0x0) {
    if (0 < (int)uVar3) {
      lVar9 = 0;
      do {
        *(undefined2 *)(&pnVar8->valuetype + lVar9) = 0;
        lVar9 = lVar9 + 0x18;
      } while ((ulong)uVar3 * 0x18 != lVar9);
    }
    ptVar1->sizehash = uVar3;
    local_38 = ctx->tbl;
    lua_pushnil(L);
    iVar4 = lua_next(L,1);
    if (iVar4 != 0) {
      do {
        pvVar7 = &local_54;
        iVar4 = ishashkey(ctx,L,(int)&local_5c,&local_54.string,&local_58,in_R9);
        if (iVar4 == 0) {
          lVar9 = (long)(int)local_5c;
          setvalue(ctx,L,(int)&local_54 + 4,(node *)pvVar7);
          ptVar1 = ctx->tbl;
          ptVar1->arraytype[lVar9 + -1] = local_3b;
          vVar2.d._4_4_ = uStack_4c;
          vVar2.string = local_54.d._4_4_;
          ptVar1->array[lVar9 + -1] = vVar2;
        }
        else {
          uVar12 = (ulong)(uint)local_54.string % (ulong)(uint)local_38->sizehash;
          if (local_38->hash[uVar12].valuetype == '\0') {
            pnVar8 = local_38->hash + uVar12;
            pnVar8->key = local_5c;
            pnVar8->keytype = (uint8_t)local_58;
            pnVar8->keyhash = local_54.string;
            pnVar8->next = -1;
            pnVar8->nocolliding = '\x01';
            setvalue(ctx,L,(int)pnVar8,(node *)(ulong)(uint)local_54.string);
          }
        }
        lua_settop(L,-2);
        iVar4 = lua_next(L,1);
      } while (iVar4 != 0);
    }
    ptVar1 = ctx->tbl;
    uVar11 = ptVar1->sizehash;
    lua_pushnil(L);
    iVar4 = lua_next(L,1);
    if (iVar4 != 0) {
      do {
        iVar4 = ishashkey(ctx,L,(int)&local_54 + 4,(int *)&local_58,&local_5c,in_R9);
        if (iVar4 != 0) {
          pnVar8 = ptVar1->hash;
          uVar12 = (ulong)local_58 % (ulong)(uint)ptVar1->sizehash;
          if ((local_5c != pnVar8[uVar12].keytype) || (pnVar8[uVar12].key != local_54.d._4_4_)) {
            if ((int)uVar11 < 1) {
LAB_001239d1:
              __assert_fail("n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/microcai[P]skynet/lualib-src/lua-sharedata.c"
                            ,0x103,"void fillcolliding(lua_State *, struct context *)");
            }
            uVar10 = 0;
            n_00 = pnVar8;
            while (n_00->valuetype != '\0') {
              uVar10 = uVar10 + 1;
              n_00 = n_00 + 1;
              if (uVar11 == uVar10) goto LAB_001239d1;
            }
            n_00->next = pnVar8[uVar12].next;
            pnVar8[uVar12].next = (int)uVar10;
            pnVar8[uVar12].nocolliding = '\0';
            n_00->key = local_54.d._4_4_;
            n_00->keytype = (uint8_t)local_5c;
            n_00->keyhash = local_58;
            n_00->nocolliding = '\0';
            setvalue(ctx,L,(int)n_00,n_00);
          }
        }
        lua_settop(L,-2);
        iVar4 = lua_next(L,1);
      } while (iVar4 != 0);
    }
    return 0;
  }
LAB_001239b2:
  luaL_error(L,"memory error");
}

Assistant:

static int
convtable(lua_State *L) {
	int i;
	struct context *ctx = lua_touserdata(L,2);
	struct table *tbl = ctx->tbl;

	tbl->L = ctx->L;

	int sizearray = lua_rawlen(L, 1);
	if (sizearray) {
		tbl->arraytype = (uint8_t *)malloc(sizearray * sizeof(uint8_t));
		if (tbl->arraytype == NULL) {
			goto memerror;
		}
		for (i=0;i<sizearray;i++) {
			tbl->arraytype[i] = VALUETYPE_NIL;
		}
		tbl->array = (union value *)malloc(sizearray * sizeof(union value));
		if (tbl->array == NULL) {
			goto memerror;
		}
		tbl->sizearray = sizearray;
	}
	int sizehash = countsize(L, sizearray);
	if (sizehash) {
		tbl->hash = (struct node *)malloc(sizehash * sizeof(struct node));
		if (tbl->hash == NULL) {
			goto memerror;
		}
		for (i=0;i<sizehash;i++) {
			tbl->hash[i].valuetype = VALUETYPE_NIL;
			tbl->hash[i].nocolliding = 0;
		}
		tbl->sizehash = sizehash;

		fillnocolliding(L, ctx);
		fillcolliding(L, ctx);
	} else {
		int i;
		for (i=1;i<=sizearray;i++) {
			lua_rawgeti(L, 1, i);
			setarray(ctx, L, -1, i);
			lua_pop(L,1);
		}
	}

	return 0;
memerror:
	return luaL_error(L, "memory error");
}